

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void partition_distinct_count_values(int *n_data,int *n,int *c)

{
  uint uVar1;
  
  uVar1 = *n_data;
  if ((int)uVar1 < 0) {
    *n_data = 0;
    uVar1 = 0;
  }
  else if (0x14 < uVar1) {
    *n_data = 0;
    *n = 0;
    *c = 0;
    return;
  }
  *n = (&DAT_002284b0)[uVar1];
  *c = *(int *)(&DAT_00228450 + (long)*n_data * 4);
  *n_data = *n_data + 1;
  return;
}

Assistant:

void partition_distinct_count_values ( int *n_data, int *n, int *c )

//****************************************************************************80
//
//  Purpose:
//
//    PARTITION_DISTINCT_COUNT_VALUES returns some values of Q(N).
//
//  Discussion:
//
//    A partition of an integer N is a representation of the integer
//    as the sum of nonzero positive integers.  The order of the summands
//    does not matter.  The number of partitions of N is symbolized
//    by P(N).  Thus, the number 5 has P(N) = 7, because it has the
//    following partitions:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//      = 3 + 1 + 1
//      = 2 + 2 + 1
//      = 2 + 1 + 1 + 1
//      = 1 + 1 + 1 + 1 + 1
//
//    However, if we require that each member of the partition
//    be distinct, so that no nonzero summand occurs more than once,
//    we are computing something symbolized by Q(N).
//    The number 5 has Q(N) = 3, because it has the following partitions
//    into distinct parts:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the integer.
//
//    Output, int *C, the number of partitions of the integer
//    into distinct parts.
//
{
# define N_MAX 21

  int c_vec[N_MAX] = {
      1, 
      1,   1,   2,   2,   3,   4,   5,   6,   8,  10, 
     12,  15,  18,  22,  27,  32,  38,  46,  54,  64 };
  int n_vec[N_MAX] = {
     0,  
     1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 
    11, 12, 13, 14, 15, 16, 17, 18, 19, 20 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *c = 0;
  }
  else
  {
    *n = n_vec[*n_data];
    *c = c_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}